

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::emit_sampled_image_op
          (CompilerHLSL *this,uint32_t result_type,uint32_t result_id,uint32_t image_id,
          uint32_t samp_id)

{
  uint32_t samp_id_local;
  uint32_t image_id_local;
  uint32_t result_type_local;
  string local_40;
  
  samp_id_local = samp_id;
  image_id_local = image_id;
  result_type_local = result_type;
  if (((this->hlsl_options).shader_model < 0x28) ||
     ((this->super_CompilerGLSL).super_Compiler.combined_image_samplers.
      super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size != 0)) {
    CompilerGLSL::to_combined_image_sampler_abi_cxx11_
              (&local_40,&this->super_CompilerGLSL,(VariableID)image_id,(VariableID)samp_id);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,result_id,&local_40,true,true);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    Compiler::set<spirv_cross::SPIRCombinedImageSampler,unsigned_int&,unsigned_int&,unsigned_int&>
              ((Compiler *)this,result_id,&result_type_local,&image_id_local,&samp_id_local);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_sampled_image_op(uint32_t result_type, uint32_t result_id, uint32_t image_id, uint32_t samp_id)
{
	if (hlsl_options.shader_model >= 40 && combined_image_samplers.empty())
	{
		set<SPIRCombinedImageSampler>(result_id, result_type, image_id, samp_id);
	}
	else
	{
		// Make sure to suppress usage tracking. It is illegal to create temporaries of opaque types.
		emit_op(result_type, result_id, to_combined_image_sampler(image_id, samp_id), true, true);
	}
}